

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

uint8_t * __thiscall
edition_unittest::TestChildExtensionData::_InternalSerialize
          (TestChildExtensionData *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  TestChildExtensionData_NestedTestAllExtensionsData *value;
  bool bVar1;
  int cached_size;
  uint32_t *puVar2;
  WireFormatLite *pWVar3;
  size_type sVar4;
  UnknownFieldSet *unknown_fields;
  char *in_R9;
  string_view field_name;
  string_view field_name_00;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  undefined1 local_70 [8];
  string_view _s_1;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined1 local_40 [8];
  string_view _s;
  uint32_t cached_has_bits;
  TestChildExtensionData *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestChildExtensionData *this_local;
  
  _s._M_str._4_4_ = 0;
  puVar2 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  _s._M_str._4_4_ = *puVar2;
  stream_local = (EpsCopyOutputStream *)target;
  if ((_s._M_str._4_4_ & 1) != 0) {
    _local_40 = _internal_a(this);
    pWVar3 = (WireFormatLite *)
             std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_40);
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_40);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_50,"edition_unittest.TestChildExtensionData.a");
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)local_50._M_str;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pWVar3,(char *)(sVar4 & 0xffffffff),1,(Operation)local_50._M_len,field_name);
    _s_1._M_str = (char *)local_40;
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,1,_local_40,target);
  }
  if ((_s._M_str._4_4_ & 2) != 0) {
    _local_70 = _internal_b(this);
    pWVar3 = (WireFormatLite *)
             std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_70);
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_80,"edition_unittest.TestChildExtensionData.b");
    field_name_00._M_str = in_R9;
    field_name_00._M_len = (size_t)local_80._M_str;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pWVar3,(char *)(sVar4 & 0xffffffff),1,(Operation)local_80._M_len,field_name_00);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,2,_local_70,(uint8_t *)stream_local);
  }
  if ((_s._M_str._4_4_ & 4) != 0) {
    value = (this->field_0)._impl_.optional_extension_;
    cached_size = TestChildExtensionData_NestedTestAllExtensionsData::GetCachedSize
                            ((this->field_0)._impl_.optional_extension_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (3,(MessageLite *)value,cached_size,(uint8_t *)stream_local,stream);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestChildExtensionData::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestChildExtensionData& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestChildExtensionData)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // string a = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::absl::string_view _s = this_._internal_a();
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestChildExtensionData.a");
    target = stream->WriteStringMaybeAliased(1, _s, target);
  }

  // string b = 2;
  if ((cached_has_bits & 0x00000002u) != 0) {
    const ::absl::string_view _s = this_._internal_b();
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestChildExtensionData.b");
    target = stream->WriteStringMaybeAliased(2, _s, target);
  }

  // .edition_unittest.TestChildExtensionData.NestedTestAllExtensionsData optional_extension = 3;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        3, *this_._impl_.optional_extension_, this_._impl_.optional_extension_->GetCachedSize(), target,
        stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestChildExtensionData)
  return target;
}